

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

void jieba_add_user_words(jieba_t *handle,char **words,size_t count)

{
  size_t sVar1;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    std::__cxx11::string::string((string *)&local_50,words[sVar1],&local_71);
    std::__cxx11::string::string((string *)&local_70,"",&local_72);
    cppjieba::DictTrie::InsertUserWord((DictTrie *)handle,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void jieba_add_user_words(jieba_t* handle, const char** words, size_t count) {
  cppjieba::Jieba* x = (cppjieba::Jieba*)handle;
  for (size_t i = 0; i < count; i++) {
    x->InsertUserWord(words[i]);
  }
}